

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O3

void test_2d_static<1ul,1ul>(void)

{
  tuple<int,_int> dptr [1];
  value_type true_idx;
  _Head_base<1UL,_int,_false> local_58;
  _Head_base<0UL,_int,_false> local_54;
  _Tuple_impl<0UL,_int,_int> local_50;
  _Tuple_impl<0UL,_int,_int> *local_48;
  _Tuple_impl<0UL,_int,_int> *local_40;
  _Tuple_impl<0UL,_int,_int> *local_38;
  
  local_50.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl._0_1_ = 1;
  local_48 = (_Tuple_impl<0UL,_int,_int> *)CONCAT71(local_48._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x5b,"void test_2d_static() [X = 1UL, Y = 1UL]",(bool *)&local_50,(bool *)&local_48);
  local_50.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)0x1;
  local_50.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  local_48._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x5d,"void test_2d_static() [X = 1UL, Y = 1UL]",(unsigned_long *)&local_50,
             (int *)&local_48);
  local_50.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)0x1;
  local_50.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  local_48 = (_Tuple_impl<0UL,_int,_int> *)CONCAT44(local_48._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x5e,"void test_2d_static() [X = 1UL, Y = 1UL]",(unsigned_long *)&local_50,
             (int *)&local_48);
  local_50.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)0x1;
  local_50.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  local_48 = (_Tuple_impl<0UL,_int,_int> *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x60,"void test_2d_static() [X = 1UL, Y = 1UL]",(unsigned_long *)&local_50,
             (unsigned_long *)&local_48);
  local_50.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)0x1;
  local_50.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  local_48 = (_Tuple_impl<0UL,_int,_int> *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x61,"void test_2d_static() [X = 1UL, Y = 1UL]",(unsigned_long *)&local_50,
             (unsigned_long *)&local_48);
  local_50.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)0x0;
  local_50.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  local_58._M_head_impl = 0;
  do {
    local_54._M_head_impl = 0;
    do {
      local_48 = (_Tuple_impl<0UL,_int,_int> *)(long)local_58._M_head_impl;
      local_40 = local_48;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x6b,"void test_2d_static() [X = 1UL, Y = 1UL]",(unsigned_long *)&local_40,
                 (unsigned_long *)&local_48);
      local_40 = &local_50 + (long)local_58._M_head_impl + (long)local_54._M_head_impl;
      local_38 = &local_50 + (long)local_48;
      boost::detail::test_eq_impl<std::tuple<int,int>*,std::tuple<int,int>*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x6d,"void test_2d_static() [X = 1UL, Y = 1UL]",(tuple<int,_int> **)&local_40,
                 (tuple<int,_int> **)&local_38);
      local_50.super__Head_base<0UL,_int,_false>._M_head_impl = local_54._M_head_impl;
      local_50.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)local_58._M_head_impl;
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(dptr[l.index(i, j)]))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x72,"void test_2d_static() [X = 1UL, Y = 1UL]",
                 &(&local_50)[(long)local_58._M_head_impl + (long)local_54._M_head_impl].
                  super__Head_base<0UL,_int,_false>._M_head_impl,&local_54._M_head_impl);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(dptr[l.index(i, j)]))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x73,"void test_2d_static() [X = 1UL, Y = 1UL]",
                 (int *)(&local_50 + (long)local_58._M_head_impl + (long)local_54._M_head_impl),
                 &local_58._M_head_impl);
      local_54._M_head_impl = local_54._M_head_impl + 1;
    } while (local_54._M_head_impl == 0);
    local_58._M_head_impl = local_58._M_head_impl + 1;
  } while (local_58._M_head_impl == 0);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    tuple<int, int> dptr[X * Y];

    // Set all elements to a unique value.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j)]) = i;
        std::get<1>(dptr[l.index(i, j)]) = j;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j)])), j); 
    }
}